

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O3

string * re2c::genGetCondition_abi_cxx11_(void)

{
  bool bVar1;
  opt_t *poVar2;
  string *extraout_RAX;
  string *psVar3;
  long *in_RDI;
  
  poVar2 = realopt_t::operator->((realopt_t *)&DAT_0015c868);
  bVar1 = poVar2->cond_get_naked;
  realopt_t::operator->((realopt_t *)&DAT_0015c868);
  if (bVar1 == true) {
    *in_RDI = (long)(in_RDI + 2);
    std::__cxx11::string::_M_construct<char*>();
    return extraout_RAX;
  }
  *in_RDI = (long)(in_RDI + 2);
  std::__cxx11::string::_M_construct<char*>();
  psVar3 = (string *)std::__cxx11::string::append((char *)in_RDI);
  return psVar3;
}

Assistant:

std::string genGetCondition()
{
	return opts->cond_get_naked
		? opts->cond_get
		: opts->cond_get + "()";
}